

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void * sqlite3_errmsg16(sqlite3 *db)

{
  uint err_code;
  int iVar1;
  ulong uVar2;
  char *zFormat;
  u16 *puVar3;
  
  if (db == (sqlite3 *)0x0) {
    puVar3 = sqlite3_errmsg16::outOfMem;
  }
  else {
    iVar1 = sqlite3SafetyCheckSickOrOk(db);
    if (iVar1 == 0) {
      puVar3 = sqlite3_errmsg16::misuse;
    }
    else {
      if (db->mutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
      }
      if (db->mallocFailed == '\0') {
        puVar3 = (u16 *)sqlite3ValueText(db->pErr,'\x02');
        if (puVar3 == (u16 *)0x0) {
          err_code = db->errCode;
          if ((ulong)err_code == 0x204) {
            zFormat = "abort due to ROLLBACK";
          }
          else {
            uVar2 = (ulong)err_code & 0xff;
            if (uVar2 == 2 || 0x1a < (uint)uVar2) {
              zFormat = "unknown error";
            }
            else {
              zFormat = *(char **)(sqlite3ErrStr_aMsg + uVar2 * 8);
            }
          }
          sqlite3ErrorWithMsg(db,err_code,zFormat);
          puVar3 = (u16 *)sqlite3ValueText(db->pErr,'\x02');
        }
        if ((db->mallocFailed != '\0') && (db->nVdbeExec == 0)) {
          db->mallocFailed = '\0';
          (db->u1).isInterrupted = 0;
          (db->lookaside).bDisable = (db->lookaside).bDisable - 1;
        }
      }
      else {
        puVar3 = sqlite3_errmsg16::outOfMem;
      }
      if (db->mutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
      }
    }
  }
  return puVar3;
}

Assistant:

SQLITE_API const void *sqlite3_errmsg16(sqlite3 *db){
  static const u16 outOfMem[] = {
    'o', 'u', 't', ' ', 'o', 'f', ' ', 'm', 'e', 'm', 'o', 'r', 'y', 0
  };
  static const u16 misuse[] = {
    'l', 'i', 'b', 'r', 'a', 'r', 'y', ' ', 
    'r', 'o', 'u', 't', 'i', 'n', 'e', ' ', 
    'c', 'a', 'l', 'l', 'e', 'd', ' ', 
    'o', 'u', 't', ' ', 
    'o', 'f', ' ', 
    's', 'e', 'q', 'u', 'e', 'n', 'c', 'e', 0
  };

  const void *z;
  if( !db ){
    return (void *)outOfMem;
  }
  if( !sqlite3SafetyCheckSickOrOk(db) ){
    return (void *)misuse;
  }
  sqlite3_mutex_enter(db->mutex);
  if( db->mallocFailed ){
    z = (void *)outOfMem;
  }else{
    z = sqlite3_value_text16(db->pErr);
    if( z==0 ){
      sqlite3ErrorWithMsg(db, db->errCode, sqlite3ErrStr(db->errCode));
      z = sqlite3_value_text16(db->pErr);
    }
    /* A malloc() may have failed within the call to sqlite3_value_text16()
    ** above. If this is the case, then the db->mallocFailed flag needs to
    ** be cleared before returning. Do this directly, instead of via
    ** sqlite3ApiExit(), to avoid setting the database handle error message.
    */
    sqlite3OomClear(db);
  }
  sqlite3_mutex_leave(db->mutex);
  return z;
}